

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shuffle.h
# Opt level: O2

void shuffle<std::__cxx11::string>
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *array)

{
  int iVar1;
  time_t tVar2;
  uint uVar3;
  ulong uVar4;
  value_type temp;
  string local_50 [32];
  
  if (!shuffle<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
       isInitialized) {
    tVar2 = time((time_t *)0x0);
    srand((uint)tVar2);
    shuffle<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    isInitialized = true;
  }
  uVar4 = (ulong)((long)(array->
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        )._M_impl.super__Vector_impl_data._M_finish -
                 (long)(array->
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       )._M_impl.super__Vector_impl_data._M_start) >> 5 & 0xffffffff;
  while( true ) {
    uVar3 = (uint)(uVar4 - 1);
    if ((int)uVar3 < 1) break;
    iVar1 = rand();
    uVar3 = uVar3 & 0x7fffffff;
    std::__cxx11::string::string
              (local_50,(string *)
                        ((array->
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         )._M_impl.super__Vector_impl_data._M_start + uVar3));
    std::__cxx11::string::_M_assign
              ((string *)
               ((array->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start + uVar3));
    std::__cxx11::string::_M_assign
              ((string *)
               ((array->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start + iVar1 % (int)uVar4));
    std::__cxx11::string::~string(local_50);
    uVar4 = uVar4 - 1;
  }
  return;
}

Assistant:

void shuffle(std::vector<T>& array) {
    static bool isInitialized = false;
    if (!isInitialized) {
        srand(time(nullptr));
        isInitialized =  true;
    }
    for(int i = array.size()-1; i > 0; i--) {
        auto randomIndex = rand() % (i + 1);
        auto temp = array[i];
        array[i] = array[randomIndex];
        array[randomIndex] = temp;
    }
}